

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall diligent_spirv_cross::CompilerGLSL::end_scope(CompilerGLSL *this)

{
  CompilerError *this_00;
  
  if (this->indent != 0) {
    this->indent = this->indent - 1;
    statement<char_const(&)[2]>(this,(char (*) [2])0x7fee12);
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Popping empty indent stack.");
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::end_scope()
{
	if (!indent)
		SPIRV_CROSS_THROW("Popping empty indent stack.");
	indent--;
	statement("}");
}